

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_ManyArgs_Test::TestBody(FormatterTest_ManyArgs_Test *this)

{
  bool bVar1;
  size_t in_RCX;
  char *pcVar2;
  size_t sVar3;
  int *args;
  char *message;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  AssertionResult gtest_ar_3;
  string format_str;
  AssertionResult gtest_ar;
  AssertHelper local_80;
  string local_78;
  string local_58;
  string local_38;
  
  format_str_00.size_ = in_RCX;
  format_str_00.data_ = (char *)0x4;
  TestFormat<20>::format<>(&format_str,(TestFormat<20> *)"{19}",format_str_00);
  pcVar2 = "19";
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"19\"","TestFormat<20>::format(\"{19}\")",(char (*) [3])"19",
             &format_str);
  std::__cxx11::string::~string((string *)&format_str);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&format_str);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x329;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x329,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&format_str);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&format_str);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&format_str,"argument index out of range",(allocator *)&gtest_ar_3);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      format_str_01.size_ = (size_t)pcVar2;
      format_str_01.data_ = (char *)0x4;
      TestFormat<20>::format<>(&local_38,(TestFormat<20> *)"{20}",format_str_01);
      std::__cxx11::string::~string((string *)&local_38);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: TestFormat<20>::format(\"{20}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&format_str);
  }
  testing::Message::Message((Message *)&format_str);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  sVar3 = 0x32b;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x32b,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&format_str);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&format_str);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&format_str,"argument index out of range",(allocator *)&gtest_ar_3);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      format_str_02.size_ = sVar3;
      format_str_02.data_ = (char *)0x4;
      TestFormat<21>::format<>(&local_58,(TestFormat<21> *)"{21}",format_str_02);
      std::__cxx11::string::~string((string *)&local_58);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: TestFormat<21>::format(\"{21}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&format_str);
  }
  testing::Message::Message((Message *)&format_str);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args = (int *)0x32d;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x32d,pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&format_str);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&format_str);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  fmt::v5::format<char[7],int>(&format_str,(v5 *)"{{{}}}",&gtest_ar.success_,args);
  testing::AssertionSuccess();
  if (gtest_ar_3.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_ar,"argument index out of range",(allocator *)&local_80);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      format_str_03.size_ = (size_t)args;
      format_str_03.data_ = (char *)format_str._M_string_length;
      TestFormat<15>::format<>
                (&local_78,(TestFormat<15> *)format_str._M_dataplus._M_p,format_str_03);
      std::__cxx11::string::~string((string *)&local_78);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_3,
               (char (*) [129])
               "Expected: TestFormat<max_packed_args>::format(format_str) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_3.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x331,pcVar2);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  std::__cxx11::string::~string((string *)&format_str);
  return;
}

Assistant:

TEST(FormatterTest, ManyArgs) {
  EXPECT_EQ("19", TestFormat<20>::format("{19}"));
  EXPECT_THROW_MSG(TestFormat<20>::format("{20}"),
                   format_error, "argument index out of range");
  EXPECT_THROW_MSG(TestFormat<21>::format("{21}"),
                   format_error, "argument index out of range");
  enum { max_packed_args = fmt::internal::max_packed_args };
  std::string format_str = fmt::format("{{{}}}", max_packed_args + 1);
  EXPECT_THROW_MSG(TestFormat<max_packed_args>::format(format_str),
                   format_error, "argument index out of range");
}